

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_78;
  int max;
  int count;
  uint start;
  int previous0;
  uint charnum;
  int bitCount;
  U32 bitStream;
  int threshold;
  int remaining;
  int tableSize;
  int nbBits;
  BYTE *oend;
  BYTE *out;
  BYTE *ostart;
  uint writeIsSafe_local;
  uint tableLog_local;
  uint maxSymbolValue_local;
  short *normalizedCounter_local;
  size_t headerBufferSize_local;
  void *header_local;
  BYTE *local_8;
  
  threshold = 1 << ((byte)tableLog & 0x1f);
  charnum = 0;
  bVar4 = false;
  bitStream = tableLog - 5;
  bitCount = 4;
  remaining = threshold + 1;
  nbBits = tableLog + 1;
  out = (BYTE *)header;
  while( true ) {
    if (remaining < 2) {
      if ((writeIsSafe == 0) && ((BYTE *)((long)header + (headerBufferSize - 2)) < out)) {
        local_8 = (BYTE *)0xfffffffffffffffe;
      }
      else {
        *out = (BYTE)bitStream;
        out[1] = (BYTE)(bitStream >> 8);
        if (maxSymbolValue + 1 < charnum) {
          local_8 = (BYTE *)0xffffffffffffffff;
        }
        else {
          local_8 = out + ((long)((bitCount + 7) / 8) - (long)header);
        }
      }
      return (size_t)local_8;
    }
    iVar2 = bitCount;
    if (bVar4) {
      start = charnum;
      for (; normalizedCounter[charnum] == 0; charnum = charnum + 1) {
      }
      while (start + 0x18 <= charnum) {
        start = start + 0x18;
        uVar1 = (0xffff << ((byte)bitCount & 0x1f)) + bitStream;
        if ((writeIsSafe == 0) && ((BYTE *)((long)header + (headerBufferSize - 2)) < out)) {
          return 0xfffffffffffffffe;
        }
        *out = (BYTE)uVar1;
        out[1] = (BYTE)(uVar1 >> 8);
        out = out + 2;
        bitStream = uVar1 >> 0x10;
      }
      for (; start + 3 <= charnum; start = start + 3) {
        bitStream = (3 << ((byte)bitCount & 0x1f)) + bitStream;
        bitCount = bitCount + 2;
      }
      bitStream = (charnum - start << ((byte)bitCount & 0x1f)) + bitStream;
      iVar2 = bitCount + 2;
      if (0x10 < bitCount + 2) {
        if ((writeIsSafe == 0) && ((BYTE *)((long)header + (headerBufferSize - 2)) < out)) {
          return 0xfffffffffffffffe;
        }
        *out = (BYTE)bitStream;
        out[1] = (BYTE)(bitStream >> 8);
        out = out + 2;
        bitStream = bitStream >> 0x10;
        iVar2 = bitCount + -0xe;
      }
    }
    bitCount = iVar2;
    uVar1 = charnum + 1;
    iVar2 = (int)normalizedCounter[charnum];
    iVar3 = (threshold * 2 + -1) - remaining;
    local_78 = iVar2;
    if (iVar2 < 0) {
      local_78 = -iVar2;
    }
    remaining = remaining - local_78;
    count = iVar2 + 1;
    if (threshold <= count) {
      count = iVar3 + count;
    }
    bitStream = (count << ((byte)bitCount & 0x1f)) + bitStream;
    bitCount = (nbBits + bitCount) - (uint)(count < iVar3);
    bVar4 = count == 1;
    if (remaining < 1) break;
    for (; remaining < threshold; threshold = threshold >> 1) {
      nbBits = nbBits + -1;
    }
    charnum = uVar1;
    if (0x10 < bitCount) {
      if ((writeIsSafe == 0) && ((BYTE *)((long)header + (headerBufferSize - 2)) < out)) {
        return 0xfffffffffffffffe;
      }
      *out = (BYTE)bitStream;
      out[1] = (BYTE)(bitStream >> 8);
      out = out + 2;
      bitStream = bitStream >> 0x10;
      bitCount = bitCount + -0x10;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                                       const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                                       unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    bitStream = 0;
    bitCount  = 0;
    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = tableLog+1;

    while (remaining>1) {  /* stops at 1 */
        if (previous0) {
            unsigned start = charnum;
            while (!normalizedCounter[charnum]) charnum++;
            while (charnum >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (charnum >= start+3) {
                start+=3;
                bitStream += 3 << bitCount;
                bitCount += 2;
            }
            bitStream += (charnum-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[charnum++];
            int const max = (2*threshold-1)-remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold) count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previous0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    if (charnum > maxSymbolValue + 1) return ERROR(GENERIC);

    return (out-ostart);
}